

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>
cmcmd_cmake_ninja_depends_fortran(string *arg_tdi,string *arg_pp)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  char *pcVar4;
  Value *pVVar5;
  pointer pcVar6;
  undefined8 in_RDX;
  const_iterator cVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_878;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_848;
  cmFortranCompiler local_830;
  undefined1 local_7d0 [8];
  cmFortranParser parser;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmFortranSourceInfo finfo;
  Value *tdi_submodule_ext;
  Value *local_500;
  Value *tdi_submodule_sep;
  Value *local_4d8;
  Value *tdi_compiler_id;
  reference local_4b0;
  Value *tdi_include_dir;
  undefined1 local_4a0;
  undefined1 local_498 [8];
  const_iterator __end2;
  undefined1 local_478 [8];
  const_iterator __begin2;
  Value *__range2;
  Value *tdi_include_dirs;
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  undefined1 local_3f0 [8];
  Reader reader;
  ifstream tdif;
  Value *tdi;
  undefined1 local_c0 [8];
  Value tdio;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  cmFortranCompiler fc;
  string *arg_pp_local;
  string *arg_tdi_local;
  __single_object *info;
  
  fc.SModExt.field_2._8_8_ = in_RDX;
  cmFortranCompiler::cmFortranCompiler
            ((cmFortranCompiler *)
             &includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&tdio.limit_);
  Json::Value::Value((Value *)local_c0,nullValue);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&reader.features_,pcVar4,_Var2);
  Json::Reader::Reader((Reader *)local_3f0);
  bVar1 = Json::Reader::parse((Reader *)local_3f0,(istream *)&reader.features_,(Value *)local_c0,
                              false);
  if (!bVar1) {
    std::operator+(&local_430,"-E cmake_ninja_depends failed to parse ",arg_pp);
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_450,(Reader *)local_3f0);
    std::operator+(&local_410,&local_430,&local_450);
    cmSystemTools::Error(&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_430);
    std::unique_ptr<cmSourceInfo,std::default_delete<cmSourceInfo>>::
    unique_ptr<std::default_delete<cmSourceInfo>,void>
              ((unique_ptr<cmSourceInfo,std::default_delete<cmSourceInfo>> *)arg_tdi,(nullptr_t)0x0)
    ;
  }
  bVar1 = !bVar1;
  Json::Reader::~Reader((Reader *)local_3f0);
  std::ifstream::~ifstream(&reader.features_);
  if (!bVar1) {
    pVVar5 = Json::Value::operator[]((Value *)local_c0,"include-dirs");
    bVar1 = Json::Value::isArray(pVVar5);
    if (bVar1) {
      __begin2.super_ValueIteratorBase._8_8_ = pVVar5;
      cVar7 = Json::Value::begin(pVVar5);
      __end2.super_ValueIteratorBase._8_8_ = cVar7.super_ValueIteratorBase.current_._M_node;
      __begin2.super_ValueIteratorBase.current_._M_node._0_1_ =
           cVar7.super_ValueIteratorBase.isNull_;
      local_478 = (undefined1  [8])__end2.super_ValueIteratorBase._8_8_;
      cVar7 = Json::Value::end((Value *)__begin2.super_ValueIteratorBase._8_8_);
      tdi_include_dir = (Value *)cVar7.super_ValueIteratorBase.current_._M_node;
      local_4a0 = cVar7.super_ValueIteratorBase.isNull_;
      local_498 = (undefined1  [8])tdi_include_dir;
      __end2.super_ValueIteratorBase.current_._M_node._0_1_ = local_4a0;
      while (bVar1 = Json::ValueIteratorBase::operator!=
                               ((ValueIteratorBase *)local_478,(SelfType *)local_498), bVar1) {
        local_4b0 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_478);
        Json::Value::asString_abi_cxx11_((string *)&tdi_compiler_id,local_4b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tdio.limit_,(value_type *)&tdi_compiler_id);
        std::__cxx11::string::~string((string *)&tdi_compiler_id);
        Json::ValueConstIterator::operator++((ValueConstIterator *)local_478);
      }
    }
    local_4d8 = Json::Value::operator[]((Value *)local_c0,"compiler-id");
    Json::Value::asString_abi_cxx11_((string *)&tdi_submodule_sep,local_4d8);
    std::__cxx11::string::operator=
              ((string *)
               &includes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&tdi_submodule_sep);
    std::__cxx11::string::~string((string *)&tdi_submodule_sep);
    local_500 = Json::Value::operator[]((Value *)local_c0,"submodule-sep");
    Json::Value::asString_abi_cxx11_((string *)&tdi_submodule_ext,local_500);
    std::__cxx11::string::operator=
              ((string *)(fc.Id.field_2._M_local_buf + 8),(string *)&tdi_submodule_ext);
    std::__cxx11::string::~string((string *)&tdi_submodule_ext);
    pVVar5 = Json::Value::operator[]((Value *)local_c0,"submodule-ext");
    Json::Value::asString_abi_cxx11_
              ((string *)&finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count,pVVar5);
    std::__cxx11::string::operator=
              ((string *)(fc.SModSep.field_2._M_local_buf + 8),
               (string *)&finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string
              ((string *)&finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = false;
  }
  Json::Value::~Value((Value *)local_c0);
  if (!bVar1) {
    cmFortranSourceInfo::cmFortranSourceInfo
              ((cmFortranSourceInfo *)&defines._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&parser.Info);
    cmFortranCompiler::cmFortranCompiler
              (&local_830,
               (cmFortranCompiler *)
               &includes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_848,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tdio.limit_);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_878,
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&parser.Info);
    cmFortranParser_s::cmFortranParser_s
              ((cmFortranParser_s *)local_7d0,&local_830,&local_848,&local_878,
               (cmFortranSourceInfo *)&defines._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_878);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_848);
    cmFortranCompiler::~cmFortranCompiler(&local_830);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmFortranParser_FilePush((cmFortranParser *)local_7d0,pcVar4);
    if (bVar1) {
      iVar3 = cmFortran_yyparse(parser.IncludePath.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (iVar3 == 0) {
        std::make_unique<cmSourceInfo>();
        pcVar6 = std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::operator->
                           ((unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_> *)arg_tdi)
        ;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&pcVar6->Provides,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&finfo.Source.field_2 + 8));
        pcVar6 = std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::operator->
                           ((unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_> *)arg_tdi)
        ;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&pcVar6->Requires,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&finfo.Provides._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pcVar6 = std::unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>::operator->
                           ((unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_> *)arg_tdi)
        ;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&pcVar6->Includes,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&finfo.Requires._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        std::unique_ptr<cmSourceInfo,std::default_delete<cmSourceInfo>>::
        unique_ptr<std::default_delete<cmSourceInfo>,void>
                  ((unique_ptr<cmSourceInfo,std::default_delete<cmSourceInfo>> *)arg_tdi,
                   (nullptr_t)0x0);
      }
    }
    else {
      std::operator+(&local_898,"-E cmake_ninja_depends failed to open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     fc.SModExt.field_2._8_8_);
      cmSystemTools::Error(&local_898);
      std::__cxx11::string::~string((string *)&local_898);
      std::unique_ptr<cmSourceInfo,std::default_delete<cmSourceInfo>>::
      unique_ptr<std::default_delete<cmSourceInfo>,void>
                ((unique_ptr<cmSourceInfo,std::default_delete<cmSourceInfo>> *)arg_tdi,
                 (nullptr_t)0x0);
    }
    cmFortranParser_s::~cmFortranParser_s((cmFortranParser_s *)local_7d0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&parser.Info);
    cmFortranSourceInfo::~cmFortranSourceInfo
              ((cmFortranSourceInfo *)&defines._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tdio.limit_);
  cmFortranCompiler::~cmFortranCompiler
            ((cmFortranCompiler *)
             &includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (__uniq_ptr_data<cmSourceInfo,_std::default_delete<cmSourceInfo>,_true,_true>)
         (__uniq_ptr_data<cmSourceInfo,_std::default_delete<cmSourceInfo>,_true,_true>)arg_tdi;
}

Assistant:

std::unique_ptr<cmSourceInfo> cmcmd_cmake_ninja_depends_fortran(
  std::string const& arg_tdi, std::string const& arg_pp)
{
  cmFortranCompiler fc;
  std::vector<std::string> includes;
  {
    Json::Value tdio;
    Json::Value const& tdi = tdio;
    {
      cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
      Json::Reader reader;
      if (!reader.parse(tdif, tdio, false)) {
        cmSystemTools::Error("-E cmake_ninja_depends failed to parse " +
                             arg_tdi + reader.getFormattedErrorMessages());
        return nullptr;
      }
    }

    Json::Value const& tdi_include_dirs = tdi["include-dirs"];
    if (tdi_include_dirs.isArray()) {
      for (auto const& tdi_include_dir : tdi_include_dirs) {
        includes.push_back(tdi_include_dir.asString());
      }
    }

    Json::Value const& tdi_compiler_id = tdi["compiler-id"];
    fc.Id = tdi_compiler_id.asString();

    Json::Value const& tdi_submodule_sep = tdi["submodule-sep"];
    fc.SModSep = tdi_submodule_sep.asString();

    Json::Value const& tdi_submodule_ext = tdi["submodule-ext"];
    fc.SModExt = tdi_submodule_ext.asString();
  }

  cmFortranSourceInfo finfo;
  std::set<std::string> defines;
  cmFortranParser parser(fc, includes, defines, finfo);
  if (!cmFortranParser_FilePush(&parser, arg_pp.c_str())) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to open " + arg_pp);
    return nullptr;
  }
  if (cmFortran_yyparse(parser.Scanner) != 0) {
    // Failed to parse the file.
    return nullptr;
  }

  auto info = cm::make_unique<cmSourceInfo>();
  info->Provides = finfo.Provides;
  info->Requires = finfo.Requires;
  info->Includes = finfo.Includes;
  return info;
}